

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void reloadTableSchema(Parse *pParse,Table *pTab,char *zName)

{
  uint uVar1;
  sqlite3 *psVar2;
  int iVar3;
  Vdbe *p;
  Trigger *pTVar4;
  char *pcVar5;
  ulong uVar6;
  Schema **ppSVar7;
  ulong uVar8;
  
  p = pParse->pVdbe;
  if ((p != (Vdbe *)0x0) || (p = allocVdbe(pParse), p != (Vdbe *)0x0)) {
    psVar2 = pParse->db;
    if (pTab->pSchema == (Schema *)0x0) {
      uVar8 = 0xfff0bdc0;
    }
    else {
      uVar1 = psVar2->nDb;
      if ((int)uVar1 < 1) {
        uVar8 = 0;
      }
      else {
        ppSVar7 = &psVar2->aDb->pSchema;
        uVar8 = 0;
        do {
          if (*ppSVar7 == pTab->pSchema) goto LAB_00253865;
          uVar8 = uVar8 + 1;
          ppSVar7 = ppSVar7 + 4;
        } while (uVar1 != uVar8);
        uVar8 = (ulong)uVar1;
      }
    }
LAB_00253865:
    for (pTVar4 = sqlite3TriggerList((Parse *)psVar2->aDb[1].pSchema,
                                     (Table *)(ulong)pParse->disableTriggers);
        pTVar4 != (Trigger *)0x0; pTVar4 = pTVar4->pNext) {
      if (pTVar4->pSchema == (Schema *)0x0) {
        uVar6 = 0xfff0bdc0;
      }
      else {
        uVar1 = pParse->db->nDb;
        if ((int)uVar1 < 1) {
          uVar6 = 0;
        }
        else {
          ppSVar7 = &pParse->db->aDb->pSchema;
          uVar6 = 0;
          do {
            if (*ppSVar7 == pTVar4->pSchema) goto LAB_002538c0;
            uVar6 = uVar6 + 1;
            ppSVar7 = ppSVar7 + 4;
          } while (uVar1 != uVar6);
          uVar6 = (ulong)uVar1;
        }
      }
LAB_002538c0:
      pcVar5 = pTVar4->zName;
      iVar3 = sqlite3VdbeAddOp3(p,0x8d,(int)uVar6,0,0);
      sqlite3VdbeChangeP4(p,iVar3,pcVar5,0);
    }
    pcVar5 = pTab->zName;
    iVar3 = sqlite3VdbeAddOp3(p,0x8b,(int)uVar8,0,0);
    sqlite3VdbeChangeP4(p,iVar3,pcVar5,0);
    pcVar5 = sqlite3MPrintf(pParse->db,"tbl_name=%Q",zName);
    if (pcVar5 != (char *)0x0) {
      sqlite3VdbeAddParseSchemaOp(p,(int)uVar8,pcVar5);
      pcVar5 = whereTempTriggers(pParse,pTab);
      if (pcVar5 != (char *)0x0) {
        sqlite3VdbeAddParseSchemaOp(p,1,pcVar5);
        return;
      }
    }
  }
  return;
}

Assistant:

static void reloadTableSchema(Parse *pParse, Table *pTab, const char *zName){
  Vdbe *v;
  char *zWhere;
  int iDb;                   /* Index of database containing pTab */
#ifndef SQLITE_OMIT_TRIGGER
  Trigger *pTrig;
#endif

  v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return;
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  assert( iDb>=0 );

#ifndef SQLITE_OMIT_TRIGGER
  /* Drop any table triggers from the internal schema. */
  for(pTrig=sqlite3TriggerList(pParse, pTab); pTrig; pTrig=pTrig->pNext){
    int iTrigDb = sqlite3SchemaToIndex(pParse->db, pTrig->pSchema);
    assert( iTrigDb==iDb || iTrigDb==1 );
    sqlite3VdbeAddOp4(v, OP_DropTrigger, iTrigDb, 0, 0, pTrig->zName, 0);
  }
#endif

  /* Drop the table and index from the internal schema.  */
  sqlite3VdbeAddOp4(v, OP_DropTable, iDb, 0, 0, pTab->zName, 0);

  /* Reload the table, index and permanent trigger schemas. */
  zWhere = sqlite3MPrintf(pParse->db, "tbl_name=%Q", zName);
  if( !zWhere ) return;
  sqlite3VdbeAddParseSchemaOp(v, iDb, zWhere);

#ifndef SQLITE_OMIT_TRIGGER
  /* Now, if the table is not stored in the temp database, reload any temp 
  ** triggers. Don't use IN(...) in case SQLITE_OMIT_SUBQUERY is defined. 
  */
  if( (zWhere=whereTempTriggers(pParse, pTab))!=0 ){
    sqlite3VdbeAddParseSchemaOp(v, 1, zWhere);
  }
#endif
}